

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzdohrsubstruct.cpp
# Opt level: O3

void __thiscall
TPZDohrSubstruct<std::complex<float>_>::Contribute_v3
          (TPZDohrSubstruct<std::complex<float>_> *this,TPZFMatrix<std::complex<float>_> *v3,
          TPZFMatrix<std::complex<float>_> *r,TPZFMatrix<std::complex<float>_> *v1Plusv2)

{
  int iVar1;
  pair<int,_int> *ppVar2;
  TPZMatrix<std::complex<float>_> *pTVar3;
  uint uVar4;
  complex<float> *pcVar5;
  complex<float> cVar6;
  long lVar7;
  ulong uVar8;
  long lVar9;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Db;
  TPZFNMatrix<100,_std::complex<float>_> vec_t;
  float local_f58;
  float fStack_f54;
  undefined8 local_f38;
  TPZFMatrix<std::complex<float>_> local_f10;
  complex<float> local_e80 [101];
  TPZFMatrix<std::complex<float>_> local_b58;
  complex<float> local_ac8 [101];
  TPZFMatrix<std::complex<float>_> local_7a0;
  complex<float> local_710 [101];
  TPZFMatrix<std::complex<float>_> local_3e8;
  complex<float> local_358 [101];
  
  iVar1 = this->fNEquations;
  lVar7 = (long)iVar1;
  local_f10.super_TPZMatrix<std::complex<float>_>.super_TPZBaseMatrix.fCol = 1;
  local_f10.super_TPZMatrix<std::complex<float>_>.super_TPZBaseMatrix.fDecomposed = '\0';
  local_f10.super_TPZMatrix<std::complex<float>_>.super_TPZBaseMatrix.fDefPositive = '\0';
  local_f10.super_TPZMatrix<std::complex<float>_>.super_TPZBaseMatrix.super_TPZSavable.
  _vptr_TPZSavable = (_func_int **)&PTR__TPZFMatrix_01838d60;
  local_f10.fSize = 100;
  local_f10.super_TPZMatrix<std::complex<float>_>.super_TPZBaseMatrix.fRow = lVar7;
  local_f10.fElem = local_e80;
  local_f10.fGiven = local_e80;
  TPZVec<int>::TPZVec(&local_f10.fPivot.super_TPZVec<int>,0);
  local_f10.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_01815498;
  local_f10.fPivot.super_TPZVec<int>.fStore = local_f10.fPivot.fExtAlloc;
  local_f10.fPivot.super_TPZVec<int>.fNElements = 0;
  local_f10.fPivot.super_TPZVec<int>.fNAlloc = 0;
  local_f10.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0181a968;
  local_f10.fWork.fStore = (complex<float> *)0x0;
  local_f10.fWork.fNElements = 0;
  local_f10.fWork.fNAlloc = 0;
  pcVar5 = (complex<float> *)0x0;
  if ((lVar7 != 0) && (pcVar5 = local_f10.fElem, 100 < iVar1)) {
    pcVar5 = (complex<float> *)operator_new__(lVar7 << 3);
    memset(pcVar5,0,lVar7 << 3);
  }
  local_f10.fElem = pcVar5;
  local_f10.super_TPZMatrix<std::complex<float>_>.super_TPZBaseMatrix.super_TPZSavable.
  _vptr_TPZSavable = (_func_int **)&PTR__TPZFNMatrix_01838a70;
  cVar6._M_value = 0;
  memset(local_e80,0,0x328);
  TPZFMatrix<std::complex<float>_>::operator=(&local_f10,cVar6);
  iVar1 = this->fNEquations;
  local_3e8.super_TPZMatrix<std::complex<float>_>.super_TPZBaseMatrix.fCol = 1;
  local_3e8.super_TPZMatrix<std::complex<float>_>.super_TPZBaseMatrix.fDecomposed = '\0';
  local_3e8.super_TPZMatrix<std::complex<float>_>.super_TPZBaseMatrix.fDefPositive = '\0';
  local_3e8.super_TPZMatrix<std::complex<float>_>.super_TPZBaseMatrix.super_TPZSavable.
  _vptr_TPZSavable = (_func_int **)&PTR__TPZFMatrix_01838d60;
  local_3e8.fSize = 100;
  local_3e8.super_TPZMatrix<std::complex<float>_>.super_TPZBaseMatrix.fRow = (long)iVar1;
  local_3e8.fElem = local_358;
  local_3e8.fGiven = local_358;
  TPZVec<int>::TPZVec(&local_3e8.fPivot.super_TPZVec<int>,0);
  local_3e8.fPivot.super_TPZVec<int>.fStore = local_3e8.fPivot.fExtAlloc;
  local_3e8.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_01815498;
  local_3e8.fPivot.super_TPZVec<int>.fNElements = 0;
  local_3e8.fPivot.super_TPZVec<int>.fNAlloc = 0;
  local_3e8.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0181a968;
  local_3e8.fWork.fStore = (complex<float> *)0x0;
  local_3e8.fWork.fNElements = 0;
  local_3e8.fWork.fNAlloc = 0;
  if (iVar1 == 0) {
    local_3e8.fElem = (complex<float> *)0x0;
  }
  else if (100 < iVar1) {
    uVar8 = (long)iVar1 << 3;
    pcVar5 = (complex<float> *)operator_new__(uVar8);
    memset(pcVar5,0,uVar8);
    local_3e8.fElem = pcVar5;
  }
  local_3e8.super_TPZMatrix<std::complex<float>_>.super_TPZBaseMatrix.super_TPZSavable.
  _vptr_TPZSavable = (_func_int **)&PTR__TPZFNMatrix_01838a70;
  cVar6._M_value = 0;
  memset(local_358,0,0x328);
  TPZFMatrix<std::complex<float>_>::operator=(&local_3e8,cVar6);
  uVar8 = (this->fInternalEqs).fNElements;
  local_7a0.super_TPZMatrix<std::complex<float>_>.super_TPZBaseMatrix.fCol = 1;
  local_7a0.super_TPZMatrix<std::complex<float>_>.super_TPZBaseMatrix.fDecomposed = '\0';
  local_7a0.super_TPZMatrix<std::complex<float>_>.super_TPZBaseMatrix.fDefPositive = '\0';
  local_7a0.super_TPZMatrix<std::complex<float>_>.super_TPZBaseMatrix.super_TPZSavable.
  _vptr_TPZSavable = (_func_int **)&PTR__TPZFMatrix_01838d60;
  local_7a0.fSize = 100;
  local_7a0.super_TPZMatrix<std::complex<float>_>.super_TPZBaseMatrix.fRow = uVar8;
  local_7a0.fElem = local_710;
  local_7a0.fGiven = local_710;
  TPZVec<int>::TPZVec(&local_7a0.fPivot.super_TPZVec<int>,0);
  local_7a0.fPivot.super_TPZVec<int>.fStore = local_7a0.fPivot.fExtAlloc;
  local_7a0.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_01815498;
  local_7a0.fPivot.super_TPZVec<int>.fNElements = 0;
  local_7a0.fPivot.super_TPZVec<int>.fNAlloc = 0;
  local_7a0.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0181a968;
  local_7a0.fWork.fStore = (complex<float> *)0x0;
  local_7a0.fWork.fNElements = 0;
  local_7a0.fWork.fNAlloc = 0;
  if (uVar8 == 0) {
    local_7a0.fElem = (complex<float> *)0x0;
  }
  else if (100 < (long)uVar8) {
    pcVar5 = (complex<float> *)operator_new__(-(ulong)(uVar8 >> 0x3d != 0) | uVar8 << 3);
    memset(pcVar5,0,uVar8 << 3);
    local_7a0.fElem = pcVar5;
  }
  local_7a0.super_TPZMatrix<std::complex<float>_>.super_TPZBaseMatrix.super_TPZSavable.
  _vptr_TPZSavable = (_func_int **)&PTR__TPZFNMatrix_01838a70;
  cVar6._M_value = 0;
  memset(local_710,0,0x328);
  TPZFMatrix<std::complex<float>_>::operator=(&local_7a0,cVar6);
  uVar8 = (this->fInternalEqs).fNElements;
  local_b58.super_TPZMatrix<std::complex<float>_>.super_TPZBaseMatrix.fCol = 1;
  local_b58.super_TPZMatrix<std::complex<float>_>.super_TPZBaseMatrix.fDecomposed = '\0';
  local_b58.super_TPZMatrix<std::complex<float>_>.super_TPZBaseMatrix.fDefPositive = '\0';
  local_b58.super_TPZMatrix<std::complex<float>_>.super_TPZBaseMatrix.super_TPZSavable.
  _vptr_TPZSavable = (_func_int **)&PTR__TPZFMatrix_01838d60;
  local_b58.fSize = 100;
  local_b58.super_TPZMatrix<std::complex<float>_>.super_TPZBaseMatrix.fRow = uVar8;
  local_b58.fElem = local_ac8;
  local_b58.fGiven = local_ac8;
  TPZVec<int>::TPZVec(&local_b58.fPivot.super_TPZVec<int>,0);
  local_b58.fPivot.super_TPZVec<int>.fStore = local_b58.fPivot.fExtAlloc;
  local_b58.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_01815498;
  local_b58.fPivot.super_TPZVec<int>.fNElements = 0;
  local_b58.fPivot.super_TPZVec<int>.fNAlloc = 0;
  local_b58.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0181a968;
  local_b58.fWork.fStore = (complex<float> *)0x0;
  local_b58.fWork.fNElements = 0;
  local_b58.fWork.fNAlloc = 0;
  if (uVar8 == 0) {
    local_b58.fElem = (complex<float> *)0x0;
  }
  else if (100 < (long)uVar8) {
    pcVar5 = (complex<float> *)operator_new__(-(ulong)(uVar8 >> 0x3d != 0) | uVar8 << 3);
    memset(pcVar5,0,uVar8 << 3);
    local_b58.fElem = pcVar5;
  }
  local_b58.super_TPZMatrix<std::complex<float>_>.super_TPZBaseMatrix.super_TPZSavable.
  _vptr_TPZSavable = (_func_int **)&PTR__TPZFNMatrix_01838a70;
  cVar6._M_value = 0;
  memset(local_ac8,0,0x328);
  TPZFMatrix<std::complex<float>_>::operator=(&local_b58,cVar6);
  uVar4 = (uint)(this->fGlobalEqs).fNElements;
  if (0 < (int)uVar4) {
    uVar8 = 0;
    do {
      ppVar2 = (this->fGlobalEqs).fStore;
      iVar1 = ppVar2[uVar8].first;
      lVar7 = (long)ppVar2[uVar8].second;
      if (((lVar7 < 0) ||
          ((v1Plusv2->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fRow <= lVar7)) ||
         ((v1Plusv2->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fCol < 1)) {
        TPZFMatrix<std::complex<float>_>::Error
                  ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      if (((iVar1 < 0) ||
          (local_f10.super_TPZMatrix<std::complex<float>_>.super_TPZBaseMatrix.fRow <= iVar1)) ||
         (local_f10.super_TPZMatrix<std::complex<float>_>.super_TPZBaseMatrix.fCol < 1)) {
        TPZFMatrix<std::complex<float>_>::Error
                  ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      local_f10.fElem[iVar1]._M_value = v1Plusv2->fElem[lVar7]._M_value;
      uVar8 = uVar8 + 1;
    } while ((uVar4 & 0x7fffffff) != uVar8);
  }
  pTVar3 = ((this->fStiffness).fRef)->fPointer;
  (*(pTVar3->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x25])
            (pTVar3,&local_f10,&local_3e8);
  if (0 < (int)uVar4) {
    uVar8 = 0;
    do {
      ppVar2 = (this->fGlobalEqs).fStore;
      iVar1 = ppVar2[uVar8].first;
      (*(r->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.super_TPZSavable.
        _vptr_TPZSavable[0x24])(r,(long)ppVar2[uVar8].second,0);
      local_f38 = CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da);
      if (((iVar1 < 0) ||
          (local_f10.super_TPZMatrix<std::complex<float>_>.super_TPZBaseMatrix.fRow <= iVar1)) ||
         (local_f10.super_TPZMatrix<std::complex<float>_>.super_TPZBaseMatrix.fCol < 1)) {
        TPZFMatrix<std::complex<float>_>::Error
                  ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      local_f10.fElem[iVar1]._M_value = local_f38;
      uVar8 = uVar8 + 1;
    } while ((uVar4 & 0x7fffffff) != uVar8);
  }
  if (0 < (this->fInternalEqs).fNElements) {
    lVar7 = 0;
    do {
      lVar9 = (long)(this->fInternalEqs).fStore[lVar7];
      if (((lVar9 < 0) ||
          (local_f10.super_TPZMatrix<std::complex<float>_>.super_TPZBaseMatrix.fRow <= lVar9)) ||
         (local_f10.super_TPZMatrix<std::complex<float>_>.super_TPZBaseMatrix.fCol < 1)) {
        TPZFMatrix<std::complex<float>_>::Error
                  ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      if ((local_3e8.super_TPZMatrix<std::complex<float>_>.super_TPZBaseMatrix.fRow <= lVar9) ||
         (local_3e8.super_TPZMatrix<std::complex<float>_>.super_TPZBaseMatrix.fCol < 1)) {
        TPZFMatrix<std::complex<float>_>::Error
                  ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      if ((local_7a0.super_TPZMatrix<std::complex<float>_>.super_TPZBaseMatrix.fRow <= lVar7) ||
         (local_7a0.super_TPZMatrix<std::complex<float>_>.super_TPZBaseMatrix.fCol < 1)) {
        TPZFMatrix<std::complex<float>_>::Error
                  ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      local_f38._0_4_ = (float)local_f10.fElem[lVar9]._M_value;
      local_f38._4_4_ = (float)(local_f10.fElem[lVar9]._M_value >> 0x20);
      local_f58 = (float)local_3e8.fElem[lVar9]._M_value;
      fStack_f54 = (float)(local_3e8.fElem[lVar9]._M_value >> 0x20);
      local_7a0.fElem[lVar7]._M_value =
           CONCAT44(local_f38._4_4_ - fStack_f54,(float)local_f38 - local_f58);
      lVar7 = lVar7 + 1;
    } while (lVar7 < (this->fInternalEqs).fNElements);
  }
  TPZStepSolver<std::complex<float>_>::Solve
            (&this->fInvertedInternalStiffness,&local_7a0,&local_b58,
             (TPZFMatrix<std::complex<float>_> *)0x0);
  memset(local_f10.fElem,0,
         local_f10.super_TPZMatrix<std::complex<float>_>.super_TPZBaseMatrix.fRow *
         local_f10.super_TPZMatrix<std::complex<float>_>.super_TPZBaseMatrix.fCol * 8);
  local_f10.super_TPZMatrix<std::complex<float>_>.super_TPZBaseMatrix._24_2_ =
       local_f10.super_TPZMatrix<std::complex<float>_>.super_TPZBaseMatrix._24_2_ & 0xff00;
  if (0 < (this->fInternalEqs).fNElements) {
    lVar7 = 0;
    do {
      if ((local_b58.super_TPZMatrix<std::complex<float>_>.super_TPZBaseMatrix.fRow <= lVar7) ||
         (local_b58.super_TPZMatrix<std::complex<float>_>.super_TPZBaseMatrix.fCol < 1)) {
        TPZFMatrix<std::complex<float>_>::Error
                  ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      lVar9 = (long)(this->fInternalEqs).fStore[lVar7];
      if (((lVar9 < 0) ||
          (local_f10.super_TPZMatrix<std::complex<float>_>.super_TPZBaseMatrix.fRow <= lVar9)) ||
         (local_f10.super_TPZMatrix<std::complex<float>_>.super_TPZBaseMatrix.fCol < 1)) {
        TPZFMatrix<std::complex<float>_>::Error
                  ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      local_f10.fElem[lVar9]._M_value = local_b58.fElem[lVar7]._M_value;
      lVar7 = lVar7 + 1;
    } while (lVar7 < (this->fInternalEqs).fNElements);
  }
  TPZFMatrix<std::complex<float>_>::operator=(v3,&local_f10);
  TPZFMatrix<std::complex<float>_>::~TPZFMatrix(&local_b58,&PTR_PTR_01838d28);
  TPZFMatrix<std::complex<float>_>::~TPZFMatrix(&local_7a0,&PTR_PTR_01838d28);
  TPZFMatrix<std::complex<float>_>::~TPZFMatrix(&local_3e8,&PTR_PTR_01838d28);
  TPZFMatrix<std::complex<float>_>::~TPZFMatrix(&local_f10,&PTR_PTR_01838d28);
  return;
}

Assistant:

void TPZDohrSubstruct<TVar>::Contribute_v3(TPZFMatrix<TVar> &v3, const TPZFMatrix<TVar> &r, TPZFMatrix<TVar> &v1Plusv2) const {
	TPZFNMatrix<100,TVar> vec_t(fNEquations,1,0.);
	TPZFNMatrix<100,TVar> vec_t2(fNEquations,1,0.);
	TPZFNMatrix<100,TVar> vec_t3(fInternalEqs.NElements(),1,0.);
	TPZFNMatrix<100,TVar> inv_sys(fInternalEqs.NElements(),1,0.);
	int i;
	int neqs = fGlobalEqs.NElements();
	//vec_t=R(i)(v1+v2)
	for (i=0;i<neqs;i++) {
		std::pair<int,int> ind = fGlobalEqs[i];
		vec_t(ind.first,0) = v1Plusv2(ind.second,0);
	}
	//vec_t2=K(i)*vec_t
	fStiffness->Multiply(vec_t, vec_t2, 0);
	//vec_t=R(i)r
	for (i=0;i<neqs;i++) {
		std::pair<int,int> ind = fGlobalEqs[i];
		vec_t(ind.first,0) = r.GetVal(ind.second,0);
	}
	//vec_t3=R(Ii)*(vec_t - vec_t2)
	for (i=0;i<fInternalEqs.NElements();i++) {
		vec_t3(i,0) = vec_t(fInternalEqs[i],0) - vec_t2(fInternalEqs[i],0);
	}
	//inv_sys = temp_inverted * vec_t3
	fInvertedInternalStiffness.Solve(vec_t3, inv_sys);
	//vec_t=R(Ii)_transposed * inv_sys
	vec_t.Zero();
	for (i=0;i<fInternalEqs.NElements();i++) {
		vec_t(fInternalEqs[i],0) = inv_sys(i,0);
	}
#ifndef MAKEINTERNAL
	//v3=v3+R(i)_transposed*vec_t
	for (i=0;i<neqs;i++) {
		std::pair<int,int> ind = fGlobalEqs[i];
		v3(ind.second,0) += vec_t(ind.first,0);
	}
#else
	v3 = vec_t;
#endif
	
}